

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall hdc::Driver::setFlags(Driver *this,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  Driver *pDStack_10;
  int argc_local;
  Driver *this_local;
  
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pDStack_10 = this;
  for (local_24 = 1; local_24 < argv_local._4_4_; local_24 = local_24 + 1) {
    iVar1 = strcmp(ppcStack_20[local_24],"-cpp");
    if (iVar1 == 0) {
      this->emitCppFlag = true;
    }
    else {
      iVar1 = strcmp(ppcStack_20[local_24],"-log");
      if (iVar1 == 0) {
        local_24 = local_24 + 1;
        iVar1 = strcmp(ppcStack_20[local_24],"all");
        if (iVar1 == 0) {
          Logger::setAllFlags(&this->logger);
        }
      }
      else {
        iVar1 = strcmp(ppcStack_20[local_24],"-i");
        if (iVar1 == 0) {
          local_24 = local_24 + 1;
          pcVar2 = ppcStack_20[local_24];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_48,pcVar2,&local_49);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->searchPath,(value_type *)local_48);
          std::__cxx11::string::~string(local_48);
          std::allocator<char>::~allocator((allocator<char> *)&local_49);
        }
        else {
          iVar1 = strcmp(ppcStack_20[local_24],"-o");
          if (iVar1 == 0) {
            local_24 = local_24 + 1;
            std::__cxx11::string::operator=((string *)&this->outputName,ppcStack_20[local_24]);
          }
          else {
            pcVar2 = strstr(ppcStack_20[local_24],".hd");
            if (pcVar2 != (char *)0x0) {
              pcVar2 = ppcStack_20[local_24];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_80,pcVar2,&local_81);
              std::__cxx11::string::operator=((string *)&this->mainFilePath,local_80);
              std::__cxx11::string::~string(local_80);
              std::allocator<char>::~allocator((allocator<char> *)&local_81);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Driver::setFlags(int argc, char* argv[]) {
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-cpp") == 0) {
            emitCppFlag = true;
        } else if (strcmp(argv[i], "-log") == 0) {
            ++i;

            if (strcmp(argv[i], "all") == 0) {
                logger.setAllFlags();
            }
        } else if (strcmp(argv[i], "-i") == 0) {
            ++i;

            searchPath.push_back(argv[i]);
        } else if (strcmp(argv[i], "-o") == 0) {
            ++i;

            outputName = argv[i];
        } else if (strstr(argv[i], ".hd") != nullptr) {
            mainFilePath = std::string(argv[i]);
        }
    }
}